

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packetinfo.cc
# Opt level: O3

int main(int argc,char **argv)

{
  ostream *poVar1;
  long *plVar2;
  runtime_error *this;
  int *in_R9;
  ifstream f;
  array<unsigned_char,_892UL> buf;
  char local_5bc [4];
  long local_5b8 [4];
  byte abStack_598 [488];
  string local_3b0 [28];
  
  std::ifstream::ifstream(local_5b8,argv[1],_S_in);
  if (*(int *)(abStack_598 + *(long *)(local_5b8[0] + -0x18)) == 0) {
    while( true ) {
      std::istream::read((char *)local_5b8,(long)local_3b0);
      if ((abStack_598[*(long *)(local_5b8[0] + -0x18)] & 2) != 0) break;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SCID: ",6);
      poVar1 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          (uint)(byte)((char)local_3b0[0]._M_dataplus._M_p << 2 |
                                      local_3b0[0]._M_dataplus._M_p._1_1_ >> 6));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", VCID: ",8);
      poVar1 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar1,local_3b0[0]._M_dataplus._M_p._1_1_ & 0x3f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", counter: ",0xb);
      plVar2 = (long *)std::ostream::operator<<
                                 ((ostream *)poVar1,
                                  (uint)local_3b0[0]._M_dataplus._M_p._4_1_ |
                                  (uint)local_3b0[0]._M_dataplus._M_p._3_1_ << 8 |
                                  (uint)local_3b0[0]._M_dataplus._M_p._2_1_ << 0x10);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
    }
    std::ifstream::~ifstream(local_5b8);
    return 0;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_5bc[0] = '\v';
  local_5bc[1] = '\0';
  local_5bc[2] = '\0';
  local_5bc[3] = '\0';
  util::str<char[32],char[101],char[2],int>
            (local_3b0,(util *)"Assertion `f.good()` failed at ",
             (char (*) [32])
             "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/assembler/packetinfo.cc"
             ,(char (*) [101])":",(char (*) [2])local_5bc,in_R9);
  std::runtime_error::runtime_error(this,(string *)local_3b0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc, char** argv) {
  std::ifstream f(argv[1]);
  ASSERT(f.good());

  std::array<uint8_t, 892> buf;
  for (;;) {
    f.read((char*) buf.data(), buf.size());
    if (f.eof()) {
      break;
    }

    VCDU vcdu(buf);
    std::cout
      << "SCID: " << vcdu.getSCID()
      << ", VCID: " << vcdu.getVCID()
      << ", counter: " << vcdu.getCounter()
      << std::endl;
  }

  return 0;
}